

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O1

bool pvmath::houghTransform<double>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  bool bVar8;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  size_type __n;
  uint uVar13;
  pointer pPVar14;
  bool bVar15;
  double __x;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM5_Qb;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOffLine;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOnLine;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> point;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> local_d8;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> local_b8;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> local_a0;
  undefined1 local_88 [16];
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  uVar9 = Test_Helper::runCount();
  bVar15 = uVar9 == 0;
  if (!bVar15) {
    uVar13 = 0;
    do {
      iVar10 = rand();
      __x = toRadians((double)(iVar10 + -0xb4 + (iVar10 / 0x168) * -0x168));
      iVar10 = rand();
      auVar17._0_8_ = (double)(iVar10 % 99);
      auVar17._8_8_ = in_XMM5_Qb;
      auVar17 = vfmadd213sd_fma(auVar17,ZEXT816(0x3fb99999a0000000),ZEXT816(0));
      local_70 = toRadians(auVar17._0_8_ + 0.10000000149011612);
      uVar11 = rand();
      uVar7 = uVar11 % 0x32;
      if (uVar11 % 0x32 < 2) {
        uVar7 = 1;
      }
      iVar10 = rand();
      auVar18._0_8_ = (double)(iVar10 % 0x1ea);
      auVar18._8_8_ = in_XMM5_Qb;
      auVar17 = vfmadd132sd_fma(auVar18,ZEXT816(0x3fb99999a0000000),ZEXT816(0x3f847ae140000000));
      uVar11 = rand();
      __n = (size_type)(uVar11 % 100);
      if (uVar11 % 100 < 0x33) {
        __n = 0x32;
      }
      std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::vector
                (&local_a0,__n,(allocator_type *)&local_b8);
      local_58 = sin(__x);
      local_60 = cos(__x);
      if (local_a0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_a0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        dVar16 = auVar17._0_8_ * 0.5;
        auVar6._8_8_ = 0x8000000000000000;
        auVar6._0_8_ = 0x8000000000000000;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar16;
        local_88 = vxorpd_avx512vl(auVar19,auVar6);
        local_48._0_8_ = dVar16 / 10.0;
        local_48._8_8_ = 0;
        uVar3 = vcmppd_avx512vl(auVar19,ZEXT816(0) << 0x40,1);
        uVar4 = vcmppd_avx512vl(local_48,ZEXT816(0) << 0x40,1);
        uVar5 = (ushort)uVar3 & 3 | (ushort)uVar4 & 3;
        iVar10 = (int)((dVar16 + dVar16) / (double)local_48._0_8_);
        pPVar14 = local_a0.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (iVar10 < 2) {
          iVar10 = 1;
        }
        do {
          iVar12 = rand();
          auVar23._0_8_ = (double)(iVar12 % 200000);
          auVar23._8_8_ = in_XMM5_Qb;
          auVar18 = vfmadd132sd_fma(auVar23,ZEXT816(0xc08f400000000000),ZEXT816(0x3f847ae140000000))
          ;
          local_50 = auVar18._0_8_;
          dVar22 = (double)local_88._0_8_;
          dVar16 = (double)local_88._0_8_;
          if ((uVar5 & 1) == 0) {
            iVar12 = rand();
            dVar16 = local_88._0_8_;
            auVar24._0_8_ = (double)(iVar12 % iVar10);
            auVar24._8_8_ = in_XMM5_Qb;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_48._0_8_;
            auVar18 = vfmadd132sd_fma(auVar24,local_88,auVar1);
            dVar22 = auVar18._0_8_;
          }
          if ((uVar5 & 1) == 0) {
            local_68 = dVar22;
            iVar12 = rand();
            auVar20._0_8_ = (double)(iVar12 % iVar10);
            auVar20._8_8_ = in_XMM5_Qb;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_88._0_8_;
            auVar18 = vfmadd213sd_fma(auVar20,local_48,auVar2);
            dVar16 = auVar18._0_8_;
            dVar22 = local_68;
          }
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_58;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_60;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = dVar22 + local_50;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_58 * dVar16;
          auVar18 = vfmsub231sd_fma(auVar26,auVar25,auVar28);
          pPVar14->x = auVar18._0_8_;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_60 * dVar16;
          auVar18 = vfmadd231sd_fma(auVar21,auVar27,auVar25);
          pPVar14->y = auVar18._0_8_;
          pPVar14 = pPVar14 + 1;
        } while (pPVar14 !=
                 local_a0.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      local_b8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar8 = Image_Function::HoughTransform
                        (&local_a0,__x,local_70,local_70 / (double)uVar7,auVar17._0_8_,&local_b8,
                         &local_d8);
      if ((!bVar8) ||
         (local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        if (local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          return bVar15;
        }
        operator_delete(local_a0.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        return bVar15;
      }
      if (local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar13 = uVar13 + 1;
      uVar9 = Test_Helper::runCount();
      bVar15 = uVar13 >= uVar9;
    } while (uVar13 < uVar9);
  }
  return bVar15;
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }